

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlibrary_unix.cpp
# Opt level: O2

bool __thiscall QLibraryPrivate::load_sys(QLibraryPrivate *this)

{
  uint uVar1;
  QArrayDataPointer<char16_t> *pQVar2;
  QString *pQVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  bool bVar7;
  QArrayDataPointer<char16_t> *pQVar8;
  __pointer_type pvVar9;
  ulong uVar10;
  storage_type *psVar11;
  _func_void_QString_ptr *f;
  QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_const_QString_&>,_QString_&>,_const_QString_&>
  *this_00;
  char *pcVar12;
  long lVar13;
  int suffix;
  ulong uVar14;
  long in_FS_OFFSET;
  bool bVar15;
  QByteArrayView ba;
  char *local_198;
  QByteArrayView local_190;
  QArrayDataPointer<char16_t> local_180;
  QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_const_QString_&>,_QString_&>,_const_QString_&>
  local_168;
  QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_const_QString_&>,_QString_&>,_const_QString_&>
  local_148;
  QArrayDataPointer<QString> local_128;
  QArrayDataPointer<QString> local_108;
  QArrayDataPointer<char16_t> local_e8;
  QArrayDataPointer<char16_t> local_c8;
  QArrayDataPointer<char16_t> local_a8;
  QFileSystemEntry fsEntry;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._0_8_ = &this->mutex;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QBasicMutex::lock((QBasicMutex *)local_48._0_8_);
  local_48[8] = 1;
  local_a8.size = 0;
  local_a8.d = (Data *)0x0;
  local_a8.ptr = (char16_t *)0x0;
  fsEntry._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
  fsEntry.m_nativeFilePath.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  fsEntry.m_nativeFilePath.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  fsEntry.m_filePath.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  fsEntry.m_nativeFilePath.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  fsEntry.m_filePath.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  fsEntry.m_filePath.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QFileSystemEntry::QFileSystemEntry(&fsEntry,&this->fileName);
  local_c8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_c8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_c8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QFileSystemEntry::path((QString *)&local_c8,&fsEntry);
  local_e8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_e8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_e8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QFileSystemEntry::fileName((QString *)&local_e8,&fsEntry);
  local_168.a.a.a = (QString *)0x1;
  local_168.a.a.b = (QString *)0x519b5c;
  bVar7 = ::operator==((QString *)&local_c8,(QLatin1StringView *)&local_168);
  if (bVar7) {
    bVar7 = QString::startsWith(&this->fileName,(QString *)&local_c8,CaseSensitive);
    if (!bVar7) {
      QString::clear((QString *)&local_c8);
      goto LAB_00439124;
    }
  }
  QString::append((QString *)&local_c8,(QChar)0x2f);
LAB_00439124:
  local_108.size = 0;
  local_128.size = 0;
  local_108.d = (Data *)0x0;
  local_108.ptr = (QString *)0x0;
  local_128.d = (Data *)0x0;
  local_128.ptr = (QString *)0x0;
  if (this->pluginState != IsAPlugin) {
    local_148.a.a.a = (QString *)&DAT_00000003;
    local_148.a.a.b = (QString *)0x471e7c;
    QStringView::toString((QString *)&local_168,(QStringView *)&local_148);
    QList<QString>::emplaceBack<QString>((QList<QString> *)&local_128,(QString *)&local_168);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_168);
    suffixes_sys((QStringList *)&local_168,&this->fullVersion);
    QArrayDataPointer<QString>::operator=(&local_108,(QArrayDataPointer<QString> *)&local_168);
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_168);
  }
  uVar1 = (this->loadHintsInt).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i;
  bVar7 = QFileSystemEntry::isAbsolute(&fsEntry);
  if (bVar7) {
    local_168.a.a.a = (QString *)0x0;
    local_168.a.a.b = (QString *)0x0;
    local_168.a.b = (QString *)0x0;
    QList<QString>::emplaceFront<QString>((QList<QString> *)&local_108,(QString *)&local_168);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_168);
    local_168.a.a.a = (QString *)0x0;
    local_168.a.a.b = (QString *)0x0;
    local_168.a.b = (QString *)0x0;
    QList<QString>::emplaceFront<QString>((QList<QString> *)&local_128,(QString *)&local_168);
  }
  else {
    local_168.a.a.a = (QString *)0x0;
    local_168.a.a.b = (QString *)0x0;
    local_168.a.b = (QString *)0x0;
    QList<QString>::emplaceBack<QString>((QList<QString> *)&local_108,(QString *)&local_168);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_168);
    local_168.a.a.a = (QString *)0x0;
    local_168.a.a.b = (QString *)0x0;
    local_168.a.b = (QString *)0x0;
    QList<QString>::emplaceBack<QString>((QList<QString> *)&local_128,(QString *)&local_168);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_168);
  if ((~(uint)qt_cpu_features[0].super___atomic_base<unsigned_long>._M_i & 0x76ff) == 0) {
    if (this->pluginState == IsAPlugin) {
      load_sys::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)&local_108,
                 (QStringList *)load_sys::anon_class_1_0_00000001::__invoke,f);
    }
    else {
      load_sys::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)&local_128,
                 (QStringList *)load_sys::anon_class_1_0_00000001::__invoke,f);
    }
  }
  QBasicMutex::unlock((QBasicMutex *)local_48._0_8_);
  local_48._8_8_ = local_48._8_8_ & 0xffffffffffffff00;
  bVar7 = true;
  uVar10 = 0;
  pvVar9 = (__pointer_type)0x0;
  while( true ) {
    bVar15 = pvVar9 != (__pointer_type)0x0;
    if ((!bVar7) || (pvVar9 != (__pointer_type)0x0)) goto LAB_00439591;
    if ((ulong)local_128.size <= uVar10) break;
    lVar13 = 0;
    uVar14 = 0;
    pvVar9 = (__pointer_type)0x0;
    while( true ) {
      if ((!bVar7) || (pvVar9 != (__pointer_type)0x0)) goto LAB_0043957e;
      if ((ulong)local_108.size <= uVar14) break;
      if ((undefined1 *)local_c8.size == (undefined1 *)0x0) {
        bVar15 = QString::contains(local_128.ptr + uVar10,(QChar)0x2f,CaseSensitive);
        if (!bVar15) goto LAB_00439383;
LAB_0043956c:
        pvVar9 = (__pointer_type)0x0;
      }
      else {
LAB_00439383:
        if (*(long *)((long)&((local_108.ptr)->d).size + lVar13) != 0) {
          bVar15 = QString::endsWith((QString *)&local_e8,
                                     (QString *)((long)&((local_108.ptr)->d).d + lVar13),
                                     CaseSensitive);
          if (bVar15) goto LAB_0043956c;
        }
        if ((uVar1 & 4) == 0) {
          local_168.a.a.b = local_128.ptr + uVar10;
          local_168.b = (QString *)((long)&((local_108.ptr)->d).d + lVar13);
          local_168.a.a.a = (QString *)&local_c8;
          local_168.a.b = (QString *)&local_e8;
          QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_const_QString_&>,_QString_&>,_const_QString_&>
          ::convertTo<QString>((QString *)&local_148,&local_168);
          qVar6 = local_a8.size;
          pcVar5 = local_a8.ptr;
          pDVar4 = local_a8.d;
          local_a8.d = (Data *)local_148.a.a.a;
          local_a8.ptr = (char16_t *)local_148.a.a.b;
          local_148.a.a.a = (QString *)pDVar4;
          local_148.a.a.b = (QString *)pcVar5;
          local_a8.size = (qsizetype)local_148.a.b;
          local_148.a.b = (QString *)qVar6;
          this_00 = &local_148;
        }
        else {
          QString::operator=((QString *)&local_a8,(QString *)&local_e8);
          pQVar8 = (QArrayDataPointer<char16_t> *)
                   QString::indexOf((QString *)&local_a8,(QChar)0x28,0,CaseSensitive);
          pQVar3 = local_128.ptr;
          if (pQVar8 == (QArrayDataPointer<char16_t> *)0xffffffffffffffff) {
            pQVar8 = (QArrayDataPointer<char16_t> *)local_a8.size;
          }
          local_148.a.b =
               QString::insert((QString *)&local_a8,(qsizetype)pQVar8,
                               (QString *)((long)&((local_108.ptr)->d).d + lVar13));
          local_148.a.a.b = pQVar3 + uVar10;
          local_148.a.a.a = (QString *)&local_c8;
          QStringBuilder<QStringBuilder<QString_&,_const_QString_&>,_QString_&>::convertTo<QString>
                    ((QString *)&local_168,&local_148.a);
          qVar6 = local_a8.size;
          pcVar5 = local_a8.ptr;
          pDVar4 = local_a8.d;
          local_a8.d = (Data *)local_168.a.a.a;
          local_a8.ptr = (char16_t *)local_168.a.a.b;
          local_168.a.a.a = (QString *)pDVar4;
          local_168.a.a.b = (QString *)pcVar5;
          local_a8.size = (qsizetype)local_168.a.b;
          local_168.a.b = (QString *)qVar6;
          this_00 = &local_168;
        }
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this_00);
        QString::toLocal8Bit((QByteArray *)&local_168,(QString *)&local_a8);
        pcVar12 = (char *)local_168.a.a.b;
        if (local_168.a.a.b == (QString *)0x0) {
          pcVar12 = &QByteArray::_empty;
        }
        pvVar9 = (__pointer_type)
                 dlopen(pcVar12,(uVar1 & 1) + ((uVar1 & 8) << 9 | uVar1 >> 1 & 8 | (uVar1 & 2) << 7)
                                + 1);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_168);
        if (pvVar9 == (__pointer_type)0x0) {
          bVar15 = QString::startsWith(&this->fileName,(QChar)0x2f,CaseSensitive);
          if (bVar15) {
            bVar15 = QFile::exists((QString *)&local_a8);
            if (bVar15) {
              bVar7 = false;
            }
          }
          goto LAB_0043956c;
        }
      }
      uVar14 = uVar14 + 1;
      lVar13 = lVar13 + 0x18;
    }
    pvVar9 = (__pointer_type)0x0;
LAB_0043957e:
    uVar10 = uVar10 + 1;
  }
  pvVar9 = (__pointer_type)0x0;
  bVar15 = false;
LAB_00439591:
  QBasicMutex::lock((QBasicMutex *)local_48._0_8_);
  local_48[8] = true;
  if (bVar15) {
    QString::operator=(&this->qualifiedFileName,(QString *)&local_a8);
    QString::clear(&this->errorString);
  }
  else {
    psVar11 = (storage_type *)0xffffffffffffffff;
    QLibrary::tr((QString *)&local_148,"Cannot load library %1: %2",(char *)0x0,-1);
    local_198 = (char *)dlerror();
    QByteArrayView::QByteArrayView<char_*,_true>(&local_190,&local_198);
    ba.m_data = psVar11;
    ba.m_size = (qsizetype)local_190.m_data;
    QString::fromLocal8Bit((QString *)&local_180,(QString *)local_190.m_size,ba);
    QString::arg<QString_const&,QString>
              ((type *)&local_168,(QString *)&local_148,&this->fileName,(QString *)&local_180);
    pQVar2 = (QArrayDataPointer<char16_t> *)(this->errorString).d.d;
    pQVar3 = (QString *)(this->errorString).d.ptr;
    (this->errorString).d.d = (Data *)local_168.a.a.a;
    (this->errorString).d.ptr = (char16_t *)local_168.a.a.b;
    pQVar8 = (QArrayDataPointer<char16_t> *)(this->errorString).d.size;
    (this->errorString).d.size = (qsizetype)local_168.a.b;
    local_168.a.a.a = (QString *)pQVar2;
    local_168.a.a.b = pQVar3;
    local_168.a.b = (QString *)pQVar8;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_168);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_180);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_148);
  }
  (this->pHnd).super_QBasicAtomicPointer<void>._q_value._M_b._M_p = pvVar9;
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_128);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_108);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
  QFileSystemEntry::~QFileSystemEntry(&fsEntry);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar15;
  }
  __stack_chk_fail();
}

Assistant:

bool QLibraryPrivate::load_sys()
{
#if defined(Q_OS_WASM) && defined(QT_STATIC)
    // emscripten does not support dlopen when using static linking
    return false;
#endif

    QMutexLocker locker(&mutex);
    QString attempt;
    QFileSystemEntry fsEntry(fileName);

    QString path = fsEntry.path();
    QString name = fsEntry.fileName();
    if (path == "."_L1 && !fileName.startsWith(path))
        path.clear();
    else
        path += u'/';

    QStringList suffixes;
    QStringList prefixes;
    if (pluginState != IsAPlugin) {
        prefixes << prefix_sys().toString();
        suffixes = suffixes_sys(fullVersion);
    }
    int dlFlags = 0;
    auto loadHints = this->loadHints();
    if (loadHints & QLibrary::ResolveAllSymbolsHint) {
        dlFlags |= RTLD_NOW;
    } else {
        dlFlags |= RTLD_LAZY;
    }
    if (loadHints & QLibrary::ExportExternalSymbolsHint) {
        dlFlags |= RTLD_GLOBAL;
    }
#if !defined(Q_OS_CYGWIN)
    else {
        dlFlags |= RTLD_LOCAL;
    }
#endif
#if defined(RTLD_DEEPBIND)
    if (loadHints & QLibrary::DeepBindHint)
        dlFlags |= RTLD_DEEPBIND;
#endif

    // Provide access to RTLD_NODELETE flag on Unix
    // From GNU documentation on RTLD_NODELETE:
    // Do not unload the library during dlclose(). Consequently, the
    // library's specific static variables are not reinitialized if the
    // library is reloaded with dlopen() at a later time.
#if defined(RTLD_NODELETE)
    if (loadHints & QLibrary::PreventUnloadHint) {
#   ifdef Q_OS_ANDROID // RTLD_NODELETE flag is supported by Android 23+
        if (QtAndroidPrivate::androidSdkVersion() > 22)
#   endif
            dlFlags |= RTLD_NODELETE;
    }
#endif

#if defined(Q_OS_AIX)   // Not sure if any other platform actually support this thing.
    if (loadHints & QLibrary::LoadArchiveMemberHint) {
        dlFlags |= RTLD_MEMBER;
    }
#endif

    // If the filename is an absolute path then we want to try that first as it is most likely
    // what the callee wants. If we have been given a non-absolute path then lets try the
    // native library name first to avoid unnecessary calls to dlopen().
    if (fsEntry.isAbsolute()) {
        suffixes.prepend(QString());
        prefixes.prepend(QString());
    } else {
        suffixes.append(QString());
        prefixes.append(QString());
    }

#if defined(Q_PROCESSOR_X86) && !defined(Q_OS_DARWIN)
    if (qCpuHasFeature(ArchHaswell)) {
        auto transform = [](QStringList &list, void (*f)(QString *)) {
            QStringList tmp;
            qSwap(tmp, list);
            list.reserve(tmp.size() * 2);
            for (const QString &s : std::as_const(tmp)) {
                QString modifiedPath = s;
                f(&modifiedPath);
                list.append(modifiedPath);
                list.append(s);
            }
        };
        if (pluginState == IsAPlugin) {
            // add ".avx2" to each suffix in the list
            transform(suffixes, [](QString *s) { s->append(".avx2"_L1); });
        } else {
#  ifdef __GLIBC__
            // prepend "glibc-hwcaps/x86-64-v3/" to each prefix in the list
            transform(prefixes, [](QString *s) { s->prepend("glibc-hwcaps/x86-64-v3/"_L1); });
#  endif
        }
    }
#endif

    locker.unlock();
    bool retry = true;
    Handle hnd = nullptr;
    for (int prefix = 0; retry && !hnd && prefix < prefixes.size(); prefix++) {
        for (int suffix = 0; retry && !hnd && suffix < suffixes.size(); suffix++) {
            if (path.isEmpty() && prefixes.at(prefix).contains(u'/'))
                continue;
            if (!suffixes.at(suffix).isEmpty() && name.endsWith(suffixes.at(suffix)))
                continue;
            if (loadHints & QLibrary::LoadArchiveMemberHint) {
                attempt = name;
                qsizetype lparen = attempt.indexOf(u'(');
                if (lparen == -1)
                    lparen = attempt.size();
                attempt = path + prefixes.at(prefix) + attempt.insert(lparen, suffixes.at(suffix));
            } else {
                attempt = path + prefixes.at(prefix) + name + suffixes.at(suffix);
            }

            hnd = dlopen(QFile::encodeName(attempt), dlFlags);
#ifdef Q_OS_ANDROID
            if (!hnd) {
                auto attemptFromBundle = attempt;
                hnd = dlopen(QFile::encodeName(attemptFromBundle.replace(u'/', u'_')), dlFlags);
            }
#endif

            if (!hnd && fileName.startsWith(u'/') && QFile::exists(attempt)) {
                // We only want to continue if dlopen failed due to that the shared library did not exist.
                // However, we are only able to apply this check for absolute filenames (since they are
                // not influenced by the content of LD_LIBRARY_PATH, /etc/ld.so.cache, DT_RPATH etc...)
                // This is all because dlerror is flawed and cannot tell us the reason why it failed.
                retry = false;
            }
        }
    }

#ifdef Q_OS_DARWIN
    if (!hnd) {
        QByteArray utf8Bundle = fileName.toUtf8();
        QCFType<CFURLRef> bundleUrl = CFURLCreateFromFileSystemRepresentation(NULL, reinterpret_cast<const UInt8*>(utf8Bundle.data()), utf8Bundle.length(), true);
        QCFType<CFBundleRef> bundle = CFBundleCreate(NULL, bundleUrl);
        if (bundle) {
            QCFType<CFURLRef> url = CFBundleCopyExecutableURL(bundle);
            char executableFile[FILENAME_MAX];
            CFURLGetFileSystemRepresentation(url, true, reinterpret_cast<UInt8*>(executableFile), FILENAME_MAX);
            attempt = QString::fromUtf8(executableFile);
            hnd = dlopen(QFile::encodeName(attempt), dlFlags);
        }
    }
#endif

    locker.relock();
    if (!hnd) {
        errorString = QLibrary::tr("Cannot load library %1: %2")
                .arg(fileName, QString::fromLocal8Bit(dlerror()));
    }
    if (hnd) {
        qualifiedFileName = attempt;
        errorString.clear();
    }
    pHnd.storeRelaxed(hnd);
    return (hnd != nullptr);
}